

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O3

void __thiscall ktx::ValidationContext::validatePaddings(ValidationContext *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  size_t offset;
  size_t size;
  bool bVar4;
  char cVar5;
  long lVar6;
  long *plVar7;
  ulong uVar8;
  size_type *psVar9;
  ulong __val;
  pointer pkVar10;
  char cVar11;
  string __str;
  anon_class_16_2_1291d6ae check;
  size_t position;
  long *local_100;
  uint local_f8;
  long local_f0 [2];
  string local_e0;
  ktx_uint64_t local_c0;
  ktx_uint64_t local_b8;
  ulong local_b0;
  anon_class_16_2_1291d6ae local_a8;
  string local_98;
  string local_78;
  string local_58;
  size_t local_38;
  
  uVar1 = (this->header).dataFormatDescriptor.byteOffset;
  uVar2 = (this->header).dataFormatDescriptor.byteLength;
  local_b0 = (ulong)(this->header).keyValueData.byteOffset;
  uVar3 = (this->header).keyValueData.byteLength;
  local_b8 = (this->header).supercompressionGlobalData.byteOffset;
  local_c0 = (this->header).supercompressionGlobalData.byteLength;
  local_38 = (ulong)this->numLevels * 0x18 + 0x50;
  local_a8.position = &local_38;
  local_a8.this = this;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"DFD","");
  validatePaddings::anon_class_16_2_1291d6ae::operator()
            (&local_a8,(ulong)uVar1,(ulong)uVar2,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"KVD","");
  validatePaddings::anon_class_16_2_1291d6ae::operator()(&local_a8,local_b0,(ulong)uVar3,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"SGD","");
  validatePaddings::anon_class_16_2_1291d6ae::operator()(&local_a8,local_b8,local_c0,&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  pkVar10 = (this->levelIndices).
            super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>._M_impl.
            super__Vector_impl_data._M_finish;
  lVar6 = (long)pkVar10 -
          (long)(this->levelIndices).
                super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar6 != 0) {
    __val = (lVar6 >> 3) * -0x5555555555555555;
    do {
      __val = __val - 1;
      cVar11 = '\x01';
      if (9 < __val) {
        uVar8 = __val;
        cVar5 = '\x04';
        do {
          cVar11 = cVar5;
          if (uVar8 < 100) {
            cVar11 = cVar11 + -2;
            goto LAB_001aa498;
          }
          if (uVar8 < 1000) {
            cVar11 = cVar11 + -1;
            goto LAB_001aa498;
          }
          if (uVar8 < 10000) goto LAB_001aa498;
          bVar4 = 99999 < uVar8;
          uVar8 = uVar8 / 10000;
          cVar5 = cVar11 + '\x04';
        } while (bVar4);
        cVar11 = cVar11 + '\x01';
      }
LAB_001aa498:
      offset = pkVar10[-1].byteOffset;
      size = pkVar10[-1].byteLength;
      local_100 = local_f0;
      std::__cxx11::string::_M_construct((ulong)&local_100,cVar11);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_100,local_f8,__val);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_100,0,(char *)0x0,0x2106a0);
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_e0.field_2._M_allocated_capacity = *psVar9;
        local_e0.field_2._8_8_ = plVar7[3];
        local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
      }
      else {
        local_e0.field_2._M_allocated_capacity = *psVar9;
        local_e0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_e0._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      validatePaddings::anon_class_16_2_1291d6ae::operator()(&local_a8,offset,size,&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
      }
      if (local_100 != local_f0) {
        operator_delete(local_100,local_f0[0] + 1);
      }
      pkVar10 = pkVar10 + -1;
    } while (pkVar10 !=
             (this->levelIndices).
             super__Vector_base<ktxLevelIndexEntry,_std::allocator<ktxLevelIndexEntry>_>._M_impl.
             super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ValidationContext::validatePaddings() {
    const auto levelIndexOffset = sizeof(KTX_header2);
    const auto levelIndexSize = sizeof(ktxLevelIndexEntry) * numLevels;
    const auto dfdByteOffset = header.dataFormatDescriptor.byteOffset;
    const auto dfdByteLength = header.dataFormatDescriptor.byteLength;
    const auto kvdByteOffset = header.keyValueData.byteOffset;
    const auto kvdByteLength = header.keyValueData.byteLength;
    const auto sgdByteOffset = header.supercompressionGlobalData.byteOffset;
    const auto sgdByteLength = header.supercompressionGlobalData.byteLength;

    size_t position = levelIndexOffset + levelIndexSize;
    const auto check = [&](size_t offset, size_t size, std::string name) {
        if (offset == 0 || size == 0)
            return; // Block is missing, skip

        if (offset < position) {
            position = std::max(position, offset + size);
            return; // Just ignore invalid block placements regarding padding checks
        }

        const auto paddingSize = offset - position;
        const auto buffer = std::make_unique<uint8_t[]>(paddingSize);
        read(position, buffer.get(), paddingSize, "the padding before " + name);

        for (size_t i = 0; i < paddingSize; ++i)
            if (buffer[i] != 0) {
                error(Metadata::PaddingNotZero, buffer[i], fmt::format("before {} at offset {}", name, position + i));
                break; // Only report the first non-zero byte per padding, no need to spam
            }

        position = offset + size;
    };

    check(dfdByteOffset, dfdByteLength, "DFD");
    check(kvdByteOffset, kvdByteLength, "KVD");
    check(sgdByteOffset, sgdByteLength, "SGD");
    size_t i = levelIndices.size() - 1;
    for (auto it = levelIndices.rbegin(); it != levelIndices.rend(); ++it)
        check(it->byteOffset, it->byteLength, "image level " + std::to_string(i--));
}